

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::WindowImplX11(WindowImplX11 *this,WindowHandle handle)

{
  Display *pDVar1;
  XSetWindowAttributes attributes;
  
  WindowImpl::WindowImpl(&this->super_WindowImpl);
  (this->super_WindowImpl)._vptr_WindowImpl = (_func_int **)&PTR__WindowImplX11_0016baa8;
  this->m_window = 0;
  this->m_screen = 0;
  this->m_inputMethod = (XIM)0x0;
  this->m_inputContext = (XIC)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<_XEvent,_std::allocator<_XEvent>_>::_M_initialize_map
            (&(this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>,0);
  this->m_isExternal = true;
  *(undefined8 *)&this->m_oldVideoMode = 0;
  *(undefined8 *)((long)&this->m_oldRRCrtc + 4) = 0;
  this->m_hiddenCursor = 0;
  this->m_lastCursor = 0;
  this->m_keyRepeat = true;
  (this->m_previousSize).x = -1;
  (this->m_previousSize).y = -1;
  *(undefined8 *)&this->m_useSizeHints = 0;
  *(undefined8 *)((long)&this->m_iconPixmap + 4) = 0;
  this->m_iconMaskPixmap = 0;
  this->m_lastInputTime = 0;
  pDVar1 = OpenDisplay();
  this->m_display = pDVar1;
  anon_unknown.dwarf_f07af::ewmhSupported();
  this->m_screen = *(int *)(this->m_display + 0xe0);
  this->m_window = handle;
  if (handle != 0) {
    XChangeWindowAttributes(this->m_display,handle,0x800);
    setProtocols(this);
    initialize(this);
  }
  return;
}

Assistant:

WindowImplX11::WindowImplX11(WindowHandle handle) :
m_window         (0),
m_screen         (0),
m_inputMethod    (NULL),
m_inputContext   (NULL),
m_isExternal     (true),
m_oldVideoMode   (0),
m_oldRRCrtc      (0),
m_hiddenCursor   (0),
m_lastCursor     (None),
m_keyRepeat      (true),
m_previousSize   (-1, -1),
m_useSizeHints   (false),
m_fullscreen     (false),
m_cursorGrabbed  (false),
m_windowMapped   (false),
m_iconPixmap     (0),
m_iconMaskPixmap (0),
m_lastInputTime  (0)
{
    // Open a connection with the X server
    m_display = OpenDisplay();

    // Make sure to check for EWMH support before we do anything
    ewmhSupported();

    m_screen = DefaultScreen(m_display);

    // Save the window handle
    m_window = handle;

    if (m_window)
    {
        // Make sure the window is listening to all the required events
        XSetWindowAttributes attributes;
        attributes.event_mask = eventMask;

        XChangeWindowAttributes(m_display, m_window, CWEventMask, &attributes);

        // Set the WM protocols
        setProtocols();

        // Do some common initializations
        initialize();
    }
}